

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq_addon.hpp
# Opt level: O3

ssize_t __thiscall
zmq::multipart_t::send(multipart_t *this,int __fd,void *__buf,size_t __n,int __flags)

{
  _Map_pointer ppmVar1;
  bool bVar2;
  bool bVar3;
  undefined7 uVar4;
  size_t __n_00;
  uint extraout_EDX;
  undefined8 unaff_RBX;
  undefined7 uVar5;
  undefined4 in_register_00000034;
  message_t message;
  socket_base local_78;
  message_t local_70;
  
  local_78._handle = (void *)CONCAT44(in_register_00000034,__fd);
  ppmVar1 = (this->m_parts).super__Deque_base<zmq::message_t,_std::allocator<zmq::message_t>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node;
  bVar3 = ((long)(this->m_parts).super__Deque_base<zmq::message_t,_std::allocator<zmq::message_t>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_last -
           (long)(this->m_parts).super__Deque_base<zmq::message_t,_std::allocator<zmq::message_t>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_cur >> 6) +
          ((long)(this->m_parts).super__Deque_base<zmq::message_t,_std::allocator<zmq::message_t>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_cur -
           (long)(this->m_parts).super__Deque_base<zmq::message_t,_std::allocator<zmq::message_t>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_first >> 6) +
          ((long)ppmVar1 +
           ((ulong)(ppmVar1 != (_Map_pointer)0x0) * -8 -
           (long)(this->m_parts).super__Deque_base<zmq::message_t,_std::allocator<zmq::message_t>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_node) & 0xfffffffffffffff8) != 0;
  uVar4 = (int7)((ulong)unaff_RBX >> 8);
  do {
    uVar5 = uVar4;
    bVar2 = bVar3;
    if (!bVar2) {
      std::deque<zmq::message_t,_std::allocator<zmq::message_t>_>::clear(&this->m_parts);
      break;
    }
    message_t::message_t
              (&local_70,
               (this->m_parts).super__Deque_base<zmq::message_t,_std::allocator<zmq::message_t>_>.
               _M_impl.super__Deque_impl_data._M_start._M_cur);
    std::deque<zmq::message_t,_std::allocator<zmq::message_t>_>::pop_front(&this->m_parts);
    ppmVar1 = (this->m_parts).super__Deque_base<zmq::message_t,_std::allocator<zmq::message_t>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node;
    __n_00 = ((long)(this->m_parts).
                    super__Deque_base<zmq::message_t,_std::allocator<zmq::message_t>_>._M_impl.
                    super__Deque_impl_data._M_start._M_last -
              (long)(this->m_parts).
                    super__Deque_base<zmq::message_t,_std::allocator<zmq::message_t>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur >> 6) +
             ((long)(this->m_parts).
                    super__Deque_base<zmq::message_t,_std::allocator<zmq::message_t>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur -
              (long)(this->m_parts).
                    super__Deque_base<zmq::message_t,_std::allocator<zmq::message_t>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first >> 6) +
             ((long)ppmVar1 +
              ((ulong)(ppmVar1 != (_Map_pointer)0x0) * -8 -
              (long)(this->m_parts).
                    super__Deque_base<zmq::message_t,_std::allocator<zmq::message_t>_>._M_impl.
                    super__Deque_impl_data._M_start._M_node) & 0xfffffffffffffff8);
    detail::socket_base::send
              (&local_78,(int)&local_70,
               (void *)(ulong)(((uint)__buf & 0xfffffffd) + (uint)(__n_00 != 0) * 2),__n_00,__flags)
    ;
    message_t::~message_t(&local_70);
    bVar3 = __n_00 != 0;
    uVar4 = 0;
  } while ((extraout_EDX & 1) != 0);
  return CONCAT71(uVar5,~bVar2) & 0xffffff01;
}

Assistant:

bool send(socket_ref socket, int flags = 0)
    {
        flags &= ~(ZMQ_SNDMORE);
        bool more = size() > 0;
        while (more) {
            message_t message = pop();
            more = size() > 0;
#ifdef ZMQ_CPP11
            if (!socket.send(message, static_cast<send_flags>(
                                        (more ? ZMQ_SNDMORE : 0) | flags)))
                return false;
#else
            if (!socket.send(message, (more ? ZMQ_SNDMORE : 0) | flags))
                return false;
#endif
        }
        clear();
        return true;
    }